

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateMergeFromCodedStream
          (MessageGenerator *this,Printer *printer)

{
  string *value;
  int iVar1;
  FileDescriptor *pFVar2;
  FieldDescriptor *pFVar3;
  MessageGenerator *pMVar4;
  uint uVar5;
  FieldDescriptor **ppFVar6;
  FieldGenerator *pFVar7;
  ulong uVar8;
  Descriptor *pDVar9;
  int i;
  uint i_00;
  uint i_01;
  uint extraout_EDX;
  uint i_02;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar10;
  char *pcVar11;
  protobuf *this_00;
  long lVar12;
  long lVar13;
  bool bVar14;
  string local_88;
  allocator<char> local_61;
  scoped_array<const_google::protobuf::FieldDescriptor_*> ordered_fields;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  MessageGenerator *local_40;
  FieldGeneratorMap *local_38;
  
  value = &this->classname_;
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x58) == '\x01') {
    io::Printer::Print(printer,
                       "bool $classname$::MergePartialFromCodedStream(\n    ::google::protobuf::io::CodedInputStream* input) {\n"
                       ,"classname",value);
    pFVar2 = *(FileDescriptor **)(this->descriptor_ + 0x10);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
    PrintHandlingOptionalStaticInitializers
              (pFVar2,printer,
               "  return _extensions_.ParseMessageSet(input, default_instance_,\n                                      mutable_unknown_fields());\n"
               ,
               "  return _extensions_.ParseMessageSet(input, &default_instance(),\n                                      mutable_unknown_fields());\n"
               ,"classname",value,(char *)0x0,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    pcVar11 = "}\n";
  }
  else {
    io::Printer::Print(printer,
                       "bool $classname$::MergePartialFromCodedStream(\n    ::google::protobuf::io::CodedInputStream* input) {\n#define DO_(EXPRESSION) if (!(EXPRESSION)) return false\n  ::google::protobuf::uint32 tag;\n  while ((tag = input->ReadTag()) != 0) {\n"
                       ,"classname",value);
    io::Printer::Indent(printer);
    io::Printer::Indent(printer);
    local_40 = this;
    if (0 < *(int *)(this->descriptor_ + 0x2c)) {
      io::Printer::Print(printer,
                         "switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {\n"
                        );
      io::Printer::Indent(printer);
      ordered_fields.array_ = anon_unknown_0::SortFieldsByNumber(this->descriptor_);
      local_38 = &this->field_generators_;
      lVar12 = 1;
      while( true ) {
        this = local_40;
        if ((long)*(int *)(local_40->descriptor_ + 0x2c) <= lVar12 + -1) break;
        ppFVar6 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                            (&ordered_fields,lVar12 + -1);
        pFVar3 = *ppFVar6;
        anon_unknown_0::PrintFieldComment(printer,pFVar3);
        SimpleItoa_abi_cxx11_(&local_88,(protobuf *)(ulong)*(uint *)(pFVar3 + 0x28),i);
        io::Printer::Print(printer,"case $number$: {\n","number",&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        io::Printer::Indent(printer);
        pFVar7 = FieldGeneratorMap::get(local_38,pFVar3);
        uVar8 = 2;
        if (*(char *)(*(long *)(pFVar3 + 0x60) + 0x44) == '\0') {
          uVar8 = (ulong)*(uint *)(internal::WireFormatLite::kWireTypeForFieldType +
                                  (ulong)*(uint *)(pFVar3 + 0x2c) * 4);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,*(char **)((anonymous_namespace)::kWireTypeNames + uVar8 * 8)
                   ,&local_61);
        io::Printer::Print(printer,
                           "if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==\n    ::google::protobuf::internal::WireFormatLite::WIRETYPE_$wiretype$) {\n"
                           ,"wiretype",&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if ((lVar12 != 1) ||
           ((*(int *)(pFVar3 + 0x30) == 3 && (*(char *)(*(long *)(pFVar3 + 0x60) + 0x44) == '\0'))))
        {
          io::Printer::Print(printer," parse_$name$:\n","name",*(string **)pFVar3);
        }
        io::Printer::Indent(printer);
        (*pFVar7->_vptr_FieldGenerator[(ulong)*(byte *)(*(long *)(pFVar3 + 0x60) + 0x44) + 0xd])
                  (pFVar7,printer);
        io::Printer::Outdent(printer);
        bVar14 = 0xfffffffb < *(uint *)(pFVar3 + 0x2c) - 0xd;
        if (!bVar14 && *(int *)(pFVar3 + 0x30) == 3) {
          if (*(char *)(*(long *)(pFVar3 + 0x60) + 0x44) == '\x01') {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_88,
                       *(char **)((anonymous_namespace)::kWireTypeNames +
                                 (ulong)*(uint *)(internal::WireFormatLite::kWireTypeForFieldType +
                                                 (ulong)*(uint *)(pFVar3 + 0x2c) * 4) * 8),&local_61
                      );
            io::Printer::Print(printer,
                               "} else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)\n           == ::google::protobuf::internal::WireFormatLite::\n              WIRETYPE_$wiretype$) {\n"
                               ,"wiretype",&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
            lVar13 = 0x68;
            io::Printer::Indent(printer);
          }
          else {
            if ((bVar14 || *(int *)(pFVar3 + 0x30) != 3) ||
               (*(char *)(*(long *)(pFVar3 + 0x60) + 0x44) != '\0')) goto LAB_00196dd3;
            io::Printer::Print(printer,
                               "} else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)\n           == ::google::protobuf::internal::WireFormatLite::\n              WIRETYPE_LENGTH_DELIMITED) {\n"
                              );
            lVar13 = 0x70;
            io::Printer::Indent(printer);
          }
          (**(code **)((long)pFVar7->_vptr_FieldGenerator + lVar13))(pFVar7,printer);
          io::Printer::Outdent(printer);
        }
LAB_00196dd3:
        io::Printer::Print(printer,"} else {\n  goto handle_uninterpreted;\n}\n");
        pMVar4 = local_40;
        if ((*(int *)(pFVar3 + 0x30) == 3) && (*(char *)(*(long *)(pFVar3 + 0x60) + 0x44) == '\0'))
        {
          SimpleItoa_abi_cxx11_
                    (&local_88,
                     (protobuf *)
                     (ulong)(*(int *)(pFVar3 + 0x28) << 3 |
                            *(uint *)(internal::WireFormatLite::kWireTypeForFieldType +
                                     (ulong)*(uint *)(pFVar3 + 0x2c) * 4)),i_00);
          io::Printer::Print(printer,"if (input->ExpectTag($tag$)) goto parse_$name$;\n","tag",
                             &local_88,"name",*(string **)pFVar3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
        }
        if ((int)lVar12 < *(int *)(pMVar4->descriptor_ + 0x2c)) {
          ppFVar6 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                              (&ordered_fields,lVar12);
          pFVar3 = *ppFVar6;
          uVar5 = 2;
          if (*(char *)(*(long *)(pFVar3 + 0x60) + 0x44) == '\0') {
            uVar5 = *(uint *)(internal::WireFormatLite::kWireTypeForFieldType +
                             (ulong)*(uint *)(pFVar3 + 0x2c) * 4);
          }
          SimpleItoa_abi_cxx11_
                    (&local_88,(protobuf *)(ulong)(*(int *)(pFVar3 + 0x28) << 3 | uVar5),i_01);
          io::Printer::Print(printer,"if (input->ExpectTag($next_tag$)) goto parse_$next_name$;\n",
                             "next_tag",&local_88,"next_name",*(string **)pFVar3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          io::Printer::Print(printer,"if (input->ExpectAtEnd()) return true;\n");
        }
        io::Printer::Print(printer,"break;\n");
        io::Printer::Outdent(printer);
        lVar12 = lVar12 + 1;
        io::Printer::Print(printer,"}\n\n");
      }
      io::Printer::Print(printer,"default: {\nhandle_uninterpreted:\n");
      io::Printer::Indent(printer);
      if (ordered_fields.array_ != (FieldDescriptor **)0x0) {
        operator_delete__(ordered_fields.array_);
      }
    }
    io::Printer::Print(printer,
                       "if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==\n    ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {\n  return true;\n}\n"
                      );
    if (0 < *(int *)(this->descriptor_ + 0x58)) {
      io::Printer::Print(printer,"if (");
      pDVar9 = this->descriptor_;
      if (0 < *(int *)(pDVar9 + 0x58)) {
        lVar12 = 0;
        uVar10 = extraout_RDX;
        do {
          uVar5 = (uint)uVar10;
          lVar13 = *(long *)(pDVar9 + 0x60);
          if (lVar12 != 0) {
            io::Printer::Print(printer," ||\n    ");
            uVar5 = extraout_EDX;
          }
          iVar1 = *(int *)(lVar13 + 4 + lVar12 * 8);
          this_00 = (protobuf *)(ulong)(uint)(*(int *)(lVar13 + lVar12 * 8) << 3);
          if (iVar1 < 0x20000000) {
            SimpleItoa_abi_cxx11_(&local_88,this_00,uVar5);
            SimpleItoa_abi_cxx11_
                      ((string *)&ordered_fields,(protobuf *)(ulong)(uint)(iVar1 << 3),i_02);
            this = local_40;
            io::Printer::Print(printer,"($start$u <= tag && tag < $end$u)","start",&local_88,"end",
                               (string *)&ordered_fields);
            uVar10 = extraout_RDX_01;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)ordered_fields.array_ != &local_50) {
              operator_delete(ordered_fields.array_,local_50._M_allocated_capacity + 1);
              uVar10 = extraout_RDX_02;
            }
          }
          else {
            SimpleItoa_abi_cxx11_(&local_88,this_00,uVar5);
            io::Printer::Print(printer,"($start$u <= tag)","start",&local_88);
            uVar10 = extraout_RDX_00;
            this = local_40;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            uVar10 = extraout_RDX_03;
          }
          lVar12 = lVar12 + 1;
          pDVar9 = this->descriptor_;
        } while (lVar12 < *(int *)(pDVar9 + 0x58));
      }
      io::Printer::Print(printer,") {\n");
      pFVar2 = *(FileDescriptor **)(this->descriptor_ + 0x10);
      if (*(int *)(*(long *)(pFVar2 + 0x88) + 0x50) == 3) {
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
        ordered_fields.array_ = (FieldDescriptor **)&local_50;
        std::__cxx11::string::_M_construct<char_const*>((string *)&ordered_fields,"");
        PrintHandlingOptionalStaticInitializers
                  (pFVar2,printer,"  DO_(_extensions_.ParseField(tag, input, default_instance_));\n"
                   ,"  DO_(_extensions_.ParseField(tag, input, &default_instance()));\n",(char *)0x0
                   ,&local_88,(char *)0x0,(string *)&ordered_fields);
      }
      else {
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
        ordered_fields.array_ = (FieldDescriptor **)&local_50;
        std::__cxx11::string::_M_construct<char_const*>((string *)&ordered_fields,"");
        PrintHandlingOptionalStaticInitializers
                  (pFVar2,printer,
                   "  DO_(_extensions_.ParseField(tag, input, default_instance_,\n                              mutable_unknown_fields()));\n"
                   ,
                   "  DO_(_extensions_.ParseField(tag, input, &default_instance(),\n                              mutable_unknown_fields()));\n"
                   ,(char *)0x0,&local_88,(char *)0x0,(string *)&ordered_fields);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ordered_fields.array_ != &local_50) {
        operator_delete(ordered_fields.array_,local_50._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      io::Printer::Print(printer,"  continue;\n}\n");
    }
    pcVar11 = 
    "DO_(::google::protobuf::internal::WireFormat::SkipField(\n      input, tag, mutable_unknown_fields()));\n"
    ;
    if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) == 3) {
      pcVar11 = "DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));\n";
    }
    io::Printer::Print(printer,pcVar11);
    if (0 < *(int *)(this->descriptor_ + 0x2c)) {
      io::Printer::Print(printer,"break;\n");
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
    }
    io::Printer::Outdent(printer);
    io::Printer::Outdent(printer);
    pcVar11 = "  }\n  return true;\n#undef DO_\n}\n";
  }
  io::Printer::Print(printer,pcVar11);
  return;
}

Assistant:

void MessageGenerator::
GenerateMergeFromCodedStream(io::Printer* printer) {
  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    printer->Print(
      "bool $classname$::MergePartialFromCodedStream(\n"
      "    ::google::protobuf::io::CodedInputStream* input) {\n",
      "classname", classname_);

    PrintHandlingOptionalStaticInitializers(
      descriptor_->file(), printer,
      // With static initializers.
      "  return _extensions_.ParseMessageSet(input, default_instance_,\n"
      "                                      mutable_unknown_fields());\n",
      // Without.
      "  return _extensions_.ParseMessageSet(input, &default_instance(),\n"
      "                                      mutable_unknown_fields());\n",
      // Vars.
      "classname", classname_);

    printer->Print(
      "}\n");
    return;
  }

  printer->Print(
    "bool $classname$::MergePartialFromCodedStream(\n"
    "    ::google::protobuf::io::CodedInputStream* input) {\n"
    "#define DO_(EXPRESSION) if (!(EXPRESSION)) return false\n"
    "  ::google::protobuf::uint32 tag;\n"
    "  while ((tag = input->ReadTag()) != 0) {\n",
    "classname", classname_);

  printer->Indent();
  printer->Indent();

  if (descriptor_->field_count() > 0) {
    // We don't even want to print the switch() if we have no fields because
    // MSVC dislikes switch() statements that contain only a default value.

    // Note:  If we just switched on the tag rather than the field number, we
    // could avoid the need for the if() to check the wire type at the beginning
    // of each case.  However, this is actually a bit slower in practice as it
    // creates a jump table that is 8x larger and sparser, and meanwhile the
    // if()s are highly predictable.
    printer->Print(
      "switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {\n");

    printer->Indent();

    scoped_array<const FieldDescriptor*> ordered_fields(
      SortFieldsByNumber(descriptor_));

    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = ordered_fields[i];

      PrintFieldComment(printer, field);

      printer->Print(
        "case $number$: {\n",
        "number", SimpleItoa(field->number()));
      printer->Indent();
      const FieldGenerator& field_generator = field_generators_.get(field);

      // Emit code to parse the common, expected case.
      printer->Print(
        "if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==\n"
        "    ::google::protobuf::internal::WireFormatLite::WIRETYPE_$wiretype$) {\n",
        "wiretype", kWireTypeNames[WireFormat::WireTypeForField(field)]);

      if (i > 0 || (field->is_repeated() && !field->options().packed())) {
        printer->Print(
          " parse_$name$:\n",
          "name", field->name());
      }

      printer->Indent();
      if (field->options().packed()) {
        field_generator.GenerateMergeFromCodedStreamWithPacking(printer);
      } else {
        field_generator.GenerateMergeFromCodedStream(printer);
      }
      printer->Outdent();

      // Emit code to parse unexpectedly packed or unpacked values.
      if (field->is_packable() && field->options().packed()) {
        printer->Print(
          "} else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)\n"
          "           == ::google::protobuf::internal::WireFormatLite::\n"
          "              WIRETYPE_$wiretype$) {\n",
          "wiretype",
          kWireTypeNames[WireFormat::WireTypeForFieldType(field->type())]);
        printer->Indent();
        field_generator.GenerateMergeFromCodedStream(printer);
        printer->Outdent();
      } else if (field->is_packable() && !field->options().packed()) {
        printer->Print(
          "} else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)\n"
          "           == ::google::protobuf::internal::WireFormatLite::\n"
          "              WIRETYPE_LENGTH_DELIMITED) {\n");
        printer->Indent();
        field_generator.GenerateMergeFromCodedStreamWithPacking(printer);
        printer->Outdent();
      }

      printer->Print(
        "} else {\n"
        "  goto handle_uninterpreted;\n"
        "}\n");

      // switch() is slow since it can't be predicted well.  Insert some if()s
      // here that attempt to predict the next tag.
      if (field->is_repeated() && !field->options().packed()) {
        // Expect repeats of this field.
        printer->Print(
          "if (input->ExpectTag($tag$)) goto parse_$name$;\n",
          "tag", SimpleItoa(WireFormat::MakeTag(field)),
          "name", field->name());
      }

      if (i + 1 < descriptor_->field_count()) {
        // Expect the next field in order.
        const FieldDescriptor* next_field = ordered_fields[i + 1];
        printer->Print(
          "if (input->ExpectTag($next_tag$)) goto parse_$next_name$;\n",
          "next_tag", SimpleItoa(WireFormat::MakeTag(next_field)),
          "next_name", next_field->name());
      } else {
        // Expect EOF.
        // TODO(kenton):  Expect group end-tag?
        printer->Print(
          "if (input->ExpectAtEnd()) return true;\n");
      }

      printer->Print(
        "break;\n");

      printer->Outdent();
      printer->Print("}\n\n");
    }

    printer->Print(
      "default: {\n"
      "handle_uninterpreted:\n");
    printer->Indent();
  }

  // Is this an end-group tag?  If so, this must be the end of the message.
  printer->Print(
    "if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==\n"
    "    ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {\n"
    "  return true;\n"
    "}\n");

  // Handle extension ranges.
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "if (");
    for (int i = 0; i < descriptor_->extension_range_count(); i++) {
      const Descriptor::ExtensionRange* range =
        descriptor_->extension_range(i);
      if (i > 0) printer->Print(" ||\n    ");

      uint32 start_tag = WireFormatLite::MakeTag(
        range->start, static_cast<WireFormatLite::WireType>(0));
      uint32 end_tag = WireFormatLite::MakeTag(
        range->end, static_cast<WireFormatLite::WireType>(0));

      if (range->end > FieldDescriptor::kMaxNumber) {
        printer->Print(
          "($start$u <= tag)",
          "start", SimpleItoa(start_tag));
      } else {
        printer->Print(
          "($start$u <= tag && tag < $end$u)",
          "start", SimpleItoa(start_tag),
          "end", SimpleItoa(end_tag));
      }
    }
    printer->Print(") {\n");
    if (HasUnknownFields(descriptor_->file())) {
      PrintHandlingOptionalStaticInitializers(
        descriptor_->file(), printer,
        // With static initializers.
        "  DO_(_extensions_.ParseField(tag, input, default_instance_,\n"
        "                              mutable_unknown_fields()));\n",
        // Without.
        "  DO_(_extensions_.ParseField(tag, input, &default_instance(),\n"
        "                              mutable_unknown_fields()));\n");
    } else {
      PrintHandlingOptionalStaticInitializers(
        descriptor_->file(), printer,
        // With static initializers.
        "  DO_(_extensions_.ParseField(tag, input, default_instance_));\n",
        // Without.
        "  DO_(_extensions_.ParseField(tag, input, &default_instance()));\n");
    }
    printer->Print(
      "  continue;\n"
      "}\n");
  }

  // We really don't recognize this tag.  Skip it.
  if (HasUnknownFields(descriptor_->file())) {
    printer->Print(
      "DO_(::google::protobuf::internal::WireFormat::SkipField(\n"
      "      input, tag, mutable_unknown_fields()));\n");
  } else {
    printer->Print(
      "DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));\n");
  }

  if (descriptor_->field_count() > 0) {
    printer->Print("break;\n");
    printer->Outdent();
    printer->Print("}\n");    // default:
    printer->Outdent();
    printer->Print("}\n");    // switch
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(
    "  }\n"                   // while
    "  return true;\n"
    "#undef DO_\n"
    "}\n");
}